

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

void Abc_NtkDumpEquivFile(char *pFileName,Vec_Int_t *vClasses,Abc_Ntk_t **pNtks)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint local_48;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file %s for writing.\n",pFileName);
    return;
  }
  pcVar6 = (*pNtks)->pName;
  pcVar8 = pNtks[1]->pName;
  pcVar5 = Extra_TimeStamp();
  fprintf(__stream,"# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n",
          pcVar6,pcVar8,pcVar5);
  if (0 < vClasses->nSize) {
    uVar7 = 0;
    local_48 = 0;
    do {
      if ((int)uVar7 < 0) {
LAB_002ad998:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = (ulong)uVar7;
      local_48 = local_48 + 1;
      uVar10 = uVar9;
      while( true ) {
        if (vClasses->nSize <= (int)uVar7) goto LAB_002ad998;
        if ((int)(vClasses->pArray[uVar9] + uVar7 + 1) <= (int)uVar10 + 1) break;
        if (((int)(uVar7 + 1) < 0) || (vClasses->nSize <= (int)uVar10 + 1)) goto LAB_002ad998;
        uVar1 = vClasses->pArray[uVar10 + 1];
        uVar4 = (int)uVar1 >> 2;
        if ((int)uVar4 < 0) {
LAB_002ad9b7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar2 = pNtks[uVar1 & 1];
        pVVar3 = pAVar2->vObjs;
        if (pVVar3->nSize <= (int)uVar4) goto LAB_002ad9b7;
        pcVar6 = Abc_ObjName((Abc_Obj_t *)pVVar3->pArray[uVar4]);
        pcVar8 = "NOT:";
        if ((uVar1 & 2) == 0) {
          pcVar8 = "";
        }
        fprintf(__stream,"%d:%s:%s%s\n",(ulong)local_48,pAVar2->pName,pcVar8,pcVar6);
        uVar10 = uVar10 + 1;
        if ((int)uVar7 < 0) goto LAB_002ad998;
      }
      fputc(10,__stream);
      if (vClasses->nSize <= (int)uVar7) goto LAB_002ad998;
      uVar7 = uVar7 + vClasses->pArray[uVar9] + 1;
    } while ((int)uVar7 < vClasses->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkDumpEquivFile( char * pFileName, Vec_Int_t * vClasses, Abc_Ntk_t * pNtks[2] )
{
    int i, c, k, Entry;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL ) { printf( "Cannot open file %s for writing.\n", pFileName ); return; }
    fprintf( pFile, "# Node equivalences computed by ABC for networks \"%s\" and \"%s\" on %s\n\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), Extra_TimeStamp() );
    for ( i = c = 0; i < Vec_IntSize(vClasses); c++, i += 1 + Vec_IntEntry(vClasses, i) )
    {
        Vec_IntForEachEntryStartStop( vClasses, Entry, k, i + 1, i + 1 + Vec_IntEntry(vClasses, i) )
        {
            Abc_Ntk_t * pNtk = pNtks[Entry & 1];
            char * pObjName = Abc_ObjName( Abc_NtkObj(pNtk, Entry>>2) );
            fprintf( pFile, "%d:%s:%s%s\n", c+1, Abc_NtkName(pNtk), (Entry&2) ? "NOT:":"", pObjName );
        }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );
}